

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

void __thiscall ON_Layer::Dump(ON_Layer *this,ON_TextLog *dump)

{
  bool bVar1;
  char *pcVar2;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  bVar1 = ON_ModelComponent::IsHidden(&this->super_ON_ModelComponent);
  pcVar2 = "visible";
  if (bVar1) {
    pcVar2 = "hidden";
  }
  ON_TextLog::Print(dump,"display = %s\n",pcVar2);
  bVar1 = ON_ModelComponent::IsLocked(&this->super_ON_ModelComponent);
  pcVar2 = "unlocked";
  if (bVar1) {
    pcVar2 = "locked";
  }
  ON_TextLog::Print(dump,"picking = %s\n",pcVar2);
  ON_TextLog::Print(dump,"display color rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_color);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"plot color rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_plot_color);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"default material index = %d\n",(ulong)(uint)this->m_material_index);
  if (this->m_private == (ON_LayerPrivate *)0x0) {
    pcVar2 = "No custom section style\n";
  }
  else {
    pcVar2 = "Has custom section style\n";
    if ((this->m_private->m_custom_section_style).
        super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pcVar2 = "No custom section style\n";
    }
  }
  ON_TextLog::Print(dump,pcVar2);
  return;
}

Assistant:

void ON_Layer::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);
  dump.Print("display = %s\n",IsVisible()?"visible":"hidden");
  dump.Print("picking = %s\n",IsLocked()?"locked":"unlocked");
  dump.Print("display color rgb = "); dump.PrintRGB(m_color); dump.Print("\n");
  dump.Print("plot color rgb = "); dump.PrintRGB(m_plot_color); dump.Print("\n");
  dump.Print("default material index = %d\n",m_material_index);

  //{
  //  bool clipAll = true;
  //  bool clipNone = false;
  //  ON_UuidList cliplist;
  //  bool isSelectiveList = true;
  //  GetClipParticipation(clipAll, clipNone, cliplist, isSelectiveList);
  //  if (clipAll)
  //  {
  //    dump.Print("participates with all clipping planes\n");
  //  }
  //  else if (clipNone)
  //  {
  //    dump.Print("participates with no clipping planes\n");
  //  }
  //  else
  //  {
  //    dump.Print("participates with specific clipping planes\n");
  //  }
  //}

  const ON_SectionStyle* section_style = CustomSectionStyle();
  if (nullptr == section_style)
  {
    dump.Print("No custom section style\n");
  }
  else
  {
    dump.Print("Has custom section style\n");
  }
}